

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sha512_256.c
# Opt level: O3

CURLcode Curl_sha512_256it(uchar *output,uchar *input,size_t input_size)

{
  CURLcode CVar1;
  int iVar2;
  int iVar3;
  EVP_MD_CTX *in_RAX;
  Curl_sha512_256_ctx ctx;
  EVP_MD_CTX *local_38;
  
  local_38 = in_RAX;
  CVar1 = Curl_sha512_256_init(&local_38);
  if (CVar1 == CURLE_OK) {
    iVar2 = EVP_DigestUpdate(local_38,input,input_size);
    iVar3 = EVP_DigestFinal_ex(local_38,output,(uint *)0x0);
    CVar1 = CURLE_OK;
    if (iVar3 == 0) {
      CVar1 = CURLE_SSL_CIPHER;
    }
    if (iVar2 == 0) {
      CVar1 = CURLE_SSL_CIPHER;
    }
    EVP_MD_CTX_free(local_38);
  }
  return CVar1;
}

Assistant:

CURLcode
Curl_sha512_256it(unsigned char *output, const unsigned char *input,
                  size_t input_size)
{
  Curl_sha512_256_ctx ctx;
  CURLcode res;

  res = Curl_sha512_256_init(&ctx);
  if(res != CURLE_OK)
    return res;

  res = Curl_sha512_256_update(&ctx, (const void *) input, input_size);

  if(res != CURLE_OK) {
    (void) Curl_sha512_256_finish(output, &ctx);
    return res;
  }

  return Curl_sha512_256_finish(output, &ctx);
}